

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall OIDType::fromBuffer(OIDType *this,uint8_t *buf,size_t max_len)

{
  uchar *__first;
  uint8_t *dataPtr;
  int j;
  size_t max_len_local;
  uint8_t *buf_local;
  OIDType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    __first = buf + this_local._4_4_;
    if (*__first == '+') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->data,(long)(this->super_BER_CONTAINER)._length);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->data,__first,
                 __first + (this->super_BER_CONTAINER)._length);
      this->valid = true;
      this_local._4_4_ = (this->super_BER_CONTAINER)._length + 2;
    }
    else {
      this_local._4_4_ = -0x11;
    }
  }
  return this_local._4_4_;
}

Assistant:

int OIDType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* dataPtr = buf + j;

    if(*dataPtr != 0x2b) return SNMP_BUFFER_ERROR_INVALID_OID;
    this->data.reserve(_length);
    this->data.assign(dataPtr, dataPtr + _length);
    this->valid = true;

    return _length + 2;
}